

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobatto_polynomial.cpp
# Opt level: O0

double * lobatto_polynomial_derivative(int m,int n,double *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  void *pvVar6;
  void *pvVar7;
  double *pp;
  double *p;
  double *lp;
  int j;
  int i;
  double *x_local;
  int n_local;
  int m_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(m * n);
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(m * (n + 1));
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(m * (n + 1));
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar4);
  for (lp._4_4_ = 0; lp._4_4_ < m; lp._4_4_ = lp._4_4_ + 1) {
    if ((0 < n) && (pdVar5[lp._4_4_] = x[lp._4_4_] * -2.0, 1 < n)) {
      *(undefined8 *)((long)pvVar6 + (long)lp._4_4_ * 8) = 0x3ff0000000000000;
      *(double *)((long)pvVar6 + (long)(lp._4_4_ + m) * 8) = x[lp._4_4_];
      for (lp._0_4_ = 1; (int)lp < n; lp._0_4_ = (int)lp + 1) {
        *(double *)((long)pvVar6 + (long)(lp._4_4_ + ((int)lp + 1) * m) * 8) =
             ((double)((int)lp * 2 + 1) * x[lp._4_4_] *
              *(double *)((long)pvVar6 + (long)(lp._4_4_ + (int)lp * m) * 8) +
             -((double)(int)lp *
              *(double *)((long)pvVar6 + (long)(lp._4_4_ + ((int)lp + -1) * m) * 8))) /
             (double)((int)lp + 1);
      }
      *(undefined8 *)((long)pvVar7 + (long)lp._4_4_ * 8) = 0;
      *(undefined8 *)((long)pvVar7 + (long)(lp._4_4_ + m) * 8) = 0x3ff0000000000000;
      for (lp._0_4_ = 1; (int)lp < n; lp._0_4_ = (int)lp + 1) {
        *(double *)((long)pvVar7 + (long)(lp._4_4_ + ((int)lp + 1) * m) * 8) =
             ((double)((int)lp * 2 + 1) *
              (x[lp._4_4_] * *(double *)((long)pvVar7 + (long)(lp._4_4_ + (int)lp * m) * 8) +
              *(double *)((long)pvVar6 + (long)(lp._4_4_ + (int)lp * m) * 8)) +
             -((double)(int)lp *
              *(double *)((long)pvVar7 + (long)(lp._4_4_ + ((int)lp + -1) * m) * 8))) /
             (double)((int)lp + 1);
      }
      for (lp._0_4_ = 1; (int)lp < n; lp._0_4_ = (int)lp + 1) {
        pdVar5[lp._4_4_ + (int)lp * m] =
             (double)((int)lp + 1) *
             (-x[lp._4_4_] * *(double *)((long)pvVar7 + (long)(lp._4_4_ + ((int)lp + 1) * m) * 8) +
             (*(double *)((long)pvVar7 + (long)(lp._4_4_ + (int)lp * m) * 8) -
             *(double *)((long)pvVar6 + (long)(lp._4_4_ + ((int)lp + 1) * m) * 8)));
      }
    }
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  return pdVar5;
}

Assistant:

double *lobatto_polynomial_derivative ( int m, int n, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    LOBATTO_POLYNOMIAL_DERIVATIVE: derivative of completed Lobatto polynomial.
//
//  Discussion:
//
//    L(N,X)  =  N * ( P(N-1,X) - X * P(N,X) )
//    L'(N,X) =  N * ( P'(N-1,X) - P(N,X) - X * P'(N,X) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 November 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Larry Andrews,
//    Special Functions of Mathematics for Engineers,
//    Second Edition,
//    Oxford University Press, 1998,
//    ISBN: 0819426164,
//    LC: QA351.A75.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, int M, the number of evaluation points.
//
//    Input, int N, the highest order polynomial to evaluate.
//    Note that polynomials 0 through N will be evaluated.
//
//    Input, double X[M], the evaluation points.
//
//    Output, double LOBATTO_POLYNOMIAL_DERIVATIVE[M*N], the derivative of
//    the completed Lobatto polynomials of order 1 through N at the point X.
//
{
  int i;
  int j;
  double *lp;
  double *p;
  double *pp;

  lp = new double[m*n];
  p = new double[m*(n+1)];
  pp = new double[m*(n+1)];

  for ( i = 0; i < m; i++ )
  {
    if ( 1 <= n )
    {
      lp[i+0*m] = - 2.0 * x[i];

      if ( 2 <= n )
      {
        p[i+0*m] = 1.0;
        p[i+1*m] = x[i];
        for ( j = 1; j < n; j++ )
        {
          p[i+(j+1)*m] =
            ( double( 2 * j + 1 ) * x[i] * p[i+j*m]
            - double(     j     ) *        p[i+(j-1)*m] )
            / double(     j + 1 );
        }

        pp[i+0*m] = 0.0;
        pp[i+1*m] = 1.0;
        for ( j = 1; j < n; j++ )
        {
          pp[i+(j+1)*m] =
            ( double( 2 * j + 1 ) * ( p[i+j*m] + x[i] * pp[i+j*m] )
            - double(     j     ) *                     pp[i+(j-1)*m] )
            / double(     j + 1 );
        }

        for ( j = 1; j < n; j++ )
        {
          lp[i+j*m] =
            double( j + 1 )
            * ( pp[i+j*m] - p[i+(j+1)*m] - x[i] * pp[i+(j+1)*m] );
        }
      }
    }
  }

  delete [] p;
  delete [] pp;

  return lp;
}